

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

size_t Assimp::Write<aiVector3t<float>>(IOStream *stream,aiVector3D *v)

{
  (*stream->_vptr_IOStream[3])(stream,v,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->y,4,1);
  (*stream->_vptr_IOStream[3])(stream,&v->z,4,1);
  return 0xc;
}

Assistant:

inline
size_t Write<aiVector3D>(IOStream * stream, const aiVector3D& v) {
    size_t t = Write<float>(stream,v.x);
    t += Write<float>(stream,v.y);
    t += Write<float>(stream,v.z);

    return t;
}